

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O1

char * absl::lts_20250127::str_format_internal::ConsumeConversion<true>
                 (char *pos,char *end,UnboundConversion *conv,int *next_arg)

{
  Flags FVar1;
  Flags FVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined8 in_RAX;
  byte bVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  char cVar11;
  ConvTag tag;
  ConvTag tag_1;
  undefined8 uStack_38;
  
  if (pos == end) {
    return (char *)0x0;
  }
  bVar6 = *pos;
  if ((byte)(bVar6 - 0x3a) < 0xf7) {
    return (char *)0x0;
  }
  pbVar8 = (byte *)(pos + 1);
  iVar4 = bVar6 - 0x30;
  pbVar9 = pbVar8;
  if (pbVar8 != (byte *)end) {
    iVar7 = -8;
    do {
      bVar6 = *pbVar8;
      if ((byte)(bVar6 - 0x3a) < 0xf6) {
        pbVar9 = pbVar8 + 1;
        break;
      }
      pbVar9 = (byte *)(pos + 10);
      if (iVar7 == 0) break;
      pbVar8 = pbVar8 + 1;
      iVar4 = (int)(char)bVar6 + iVar4 * 10 + -0x30;
      iVar7 = iVar7 + 1;
      pbVar9 = (byte *)end;
    } while (pbVar8 != (byte *)end);
  }
  conv->arg_position = iVar4;
  if (iVar4 < 1) {
    __assert_fail("conv->arg_position > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0xe7,
                  "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = true]"
                 );
  }
  if (bVar6 != 0x24) {
    return (char *)0x0;
  }
  if (pbVar9 == (byte *)end) {
    return (char *)0x0;
  }
  if (conv->flags != kBasic) {
    __assert_fail("conv->flags == Flags::kBasic",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0xee,
                  "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = true]"
                 );
  }
  bVar6 = *pbVar9;
  pbVar9 = pbVar9 + 1;
  uStack_38 = in_RAX;
  if ((char)bVar6 < 'A') {
    do {
      if ('0' < (char)bVar6) goto LAB_0034e685;
      uStack_38 = CONCAT17(ConvTagHolder::value[bVar6].tag_,(undefined7)uStack_38);
      cVar11 = '\a';
      if ((ConvTagHolder::value[bVar6].tag_ & 0xe0) == 0xc0) {
        FVar1 = conv->flags;
        FVar2 = ConvTag::as_flags((ConvTag *)((long)&uStack_38 + 7));
        conv->flags = FVar2 | FVar1;
        cVar11 = pbVar9 == (byte *)end;
        if (!(bool)cVar11) {
          bVar6 = *pbVar9;
          pbVar9 = pbVar9 + 1;
        }
      }
    } while (cVar11 == '\0');
    if (cVar11 != '\a') {
      return (char *)0x0;
    }
LAB_0034e685:
    if ((char)bVar6 < ':') {
      if ((char)bVar6 < '0') {
        if (bVar6 == 0x2a) {
          conv->flags = conv->flags | kNonBasic;
          if (pbVar9 == (byte *)end) {
            return (char *)0x0;
          }
          bVar6 = *pbVar9;
          if ((byte)(bVar6 - 0x3a) < 0xf7) {
            return (char *)0x0;
          }
          pbVar8 = pbVar9 + 1;
          uVar5 = bVar6 - 0x30;
          pbVar10 = pbVar8;
          if (pbVar8 != (byte *)end) {
            iVar4 = -8;
            do {
              bVar6 = *pbVar8;
              if ((byte)(bVar6 - 0x3a) < 0xf6) {
                pbVar10 = pbVar8 + 1;
                break;
              }
              pbVar10 = pbVar9 + 10;
              if (iVar4 == 0) break;
              pbVar8 = pbVar8 + 1;
              uVar5 = ((int)(char)bVar6 + uVar5 * 10) - 0x30;
              iVar4 = iVar4 + 1;
              pbVar10 = (byte *)end;
            } while (pbVar8 != (byte *)end);
          }
          if ((int)uVar5 < 1) goto LAB_0034ea6b;
          (conv->width).value_ = ~uVar5;
          if (bVar6 != 0x24) {
            return (char *)0x0;
          }
          if (pbVar10 == (byte *)end) {
            return (char *)0x0;
          }
          bVar6 = *pbVar10;
          pbVar9 = pbVar10 + 1;
        }
      }
      else {
        iVar4 = bVar6 - 0x30;
        if (pbVar9 != (byte *)end) {
          pbVar8 = pbVar9 + 9;
          iVar7 = -8;
          pbVar10 = pbVar9;
          do {
            bVar6 = *pbVar10;
            if ((byte)(bVar6 - 0x3a) < 0xf6) {
              pbVar9 = pbVar10 + 1;
              break;
            }
            pbVar9 = pbVar8;
            if (iVar7 == 0) break;
            pbVar10 = pbVar10 + 1;
            iVar4 = (int)(char)bVar6 + iVar4 * 10 + -0x30;
            iVar7 = iVar7 + 1;
            pbVar9 = (byte *)end;
          } while (pbVar10 != (byte *)end);
        }
        conv->flags = conv->flags | kNonBasic;
        if (iVar4 < 0) goto LAB_0034ea4c;
        (conv->width).value_ = iVar4;
      }
    }
    if (bVar6 == 0x2e) {
      conv->flags = conv->flags | kNonBasic;
      if (pbVar9 == (byte *)end) {
        return (char *)0x0;
      }
      pbVar8 = pbVar9 + 1;
      bVar6 = *pbVar9;
      if ((byte)(bVar6 - 0x30) < 10) {
        iVar4 = bVar6 - 0x30;
        pbVar10 = pbVar8;
        if (pbVar8 != (byte *)end) {
          iVar7 = -8;
          do {
            bVar6 = *pbVar8;
            if ((byte)(bVar6 - 0x3a) < 0xf6) {
              pbVar10 = pbVar8 + 1;
              break;
            }
            pbVar10 = pbVar9 + 10;
            if (iVar7 == 0) break;
            pbVar8 = pbVar8 + 1;
            iVar4 = (int)(char)bVar6 + iVar4 * 10 + -0x30;
            iVar7 = iVar7 + 1;
            pbVar10 = (byte *)end;
          } while (pbVar8 != (byte *)end);
        }
        if (iVar4 < 0) {
LAB_0034ea4c:
          __assert_fail("value >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                        ,0x2e,
                        "void absl::str_format_internal::UnboundConversion::InputValue::set_value(int)"
                       );
        }
        (conv->precision).value_ = iVar4;
        pbVar9 = pbVar10;
      }
      else if (bVar6 == 0x2a) {
        if (pbVar8 == (byte *)end) {
          return (char *)0x0;
        }
        bVar6 = *pbVar8;
        if ((byte)(bVar6 - 0x3a) < 0xf7) {
          return (char *)0x0;
        }
        pbVar8 = pbVar9 + 2;
        uVar5 = bVar6 - 0x30;
        pbVar10 = pbVar8;
        if (pbVar8 != (byte *)end) {
          iVar4 = -8;
          do {
            bVar6 = *pbVar8;
            if ((byte)(bVar6 - 0x3a) < 0xf6) {
              pbVar10 = pbVar8 + 1;
              break;
            }
            pbVar10 = pbVar9 + 0xb;
            if (iVar4 == 0) break;
            pbVar8 = pbVar8 + 1;
            uVar5 = ((int)(char)bVar6 + uVar5 * 10) - 0x30;
            iVar4 = iVar4 + 1;
            pbVar10 = (byte *)end;
          } while (pbVar8 != (byte *)end);
        }
        if ((int)uVar5 < 1) {
LAB_0034ea6b:
          __assert_fail("value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                        ,0x39,
                        "void absl::str_format_internal::UnboundConversion::InputValue::set_from_arg(int)"
                       );
        }
        (conv->precision).value_ = ~uVar5;
        if (pbVar10 == (byte *)end || bVar6 != 0x24) {
          return (char *)0x0;
        }
        bVar6 = *pbVar10;
        pbVar9 = pbVar10 + 1;
      }
      else {
        (conv->precision).value_ = 0;
        pbVar9 = pbVar8;
      }
    }
  }
  uStack_38._0_7_ = CONCAT16(ConvTagHolder::value[bVar6].tag_,(undefined6)uStack_38);
  if (((bVar6 == 0x76) && (conv->flags != kBasic)) ||
     ((char)ConvTagHolder::value[bVar6].tag_ < '\0')) {
    return (char *)0x0;
  }
  bVar3 = CheckFastPathSetting(conv);
  if (!bVar3) {
    __assert_fail("CheckFastPathSetting(*conv)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x14d,
                  "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = true]"
                 );
  }
  if ((char)uStack_38._6_1_ < '\0') {
    __assert_fail("is_conv()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,99,"FormatConversionChar absl::str_format_internal::ConvTag::as_conv() const");
  }
  conv->conv = uStack_38._6_1_;
  return (char *)pbVar9;
}

Assistant:

constexpr const char* ConsumeConversion(const char* pos, const char* const end,
                                        UnboundConversion* conv,
                                        int* next_arg) {
  const char* const original_pos = pos;
  char c = 0;
  // Read the next char into `c` and update `pos`. Returns false if there are
  // no more chars to read.
#define ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR()          \
  do {                                                  \
    if (ABSL_PREDICT_FALSE(pos == end)) return nullptr; \
    c = *pos++;                                         \
  } while (0)

  if (is_positional) {
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
    conv->arg_position = ParseDigits(c, pos, end);
    assert(conv->arg_position > 0);
    if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
  }

  ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();

  // We should start with the basic flag on.
  assert(conv->flags == Flags::kBasic);

  // Any non alpha character makes this conversion not basic.
  // This includes flags (-+ #0), width (1-9, *) or precision (.).
  // All conversion characters and length modifiers are alpha characters.
  if (c < 'A') {
    while (c <= '0') {
      auto tag = GetTagForChar(c);
      if (tag.is_flags()) {
        conv->flags = conv->flags | tag.as_flags();
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      } else {
        break;
      }
    }

    if (c <= '9') {
      if (c >= '0') {
        int maybe_width = ParseDigits(c, pos, end);
        if (!is_positional && c == '$') {
          if (ABSL_PREDICT_FALSE(*next_arg != 0)) return nullptr;
          // Positional conversion.
          *next_arg = -1;
          return ConsumeConversion<true>(original_pos, end, conv, next_arg);
        }
        conv->flags = conv->flags | Flags::kNonBasic;
        conv->width.set_value(maybe_width);
      } else if (c == '*') {
        conv->flags = conv->flags | Flags::kNonBasic;
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->width.set_from_arg(ParseDigits(c, pos, end));
          if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->width.set_from_arg(++*next_arg);
        }
      }
    }

    if (c == '.') {
      conv->flags = conv->flags | Flags::kNonBasic;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      if ('0' <= c && c <= '9') {
        conv->precision.set_value(ParseDigits(c, pos, end));
      } else if (c == '*') {
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->precision.set_from_arg(ParseDigits(c, pos, end));
          if (c != '$') return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->precision.set_from_arg(++*next_arg);
        }
      } else {
        conv->precision.set_value(0);
      }
    }
  }

  auto tag = GetTagForChar(c);

  if (ABSL_PREDICT_FALSE(c == 'v' && conv->flags != Flags::kBasic)) {
    return nullptr;
  }

  if (ABSL_PREDICT_FALSE(!tag.is_conv())) {
    if (ABSL_PREDICT_FALSE(!tag.is_length())) return nullptr;

    // It is a length modifier.
    LengthMod length_mod = tag.as_length();
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (c == 'h' && length_mod == LengthMod::h) {
      conv->length_mod = LengthMod::hh;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else if (c == 'l' && length_mod == LengthMod::l) {
      conv->length_mod = LengthMod::ll;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else {
      conv->length_mod = length_mod;
    }
    tag = GetTagForChar(c);

    if (ABSL_PREDICT_FALSE(c == 'v')) return nullptr;
    if (ABSL_PREDICT_FALSE(!tag.is_conv())) return nullptr;

    // `wchar_t` args are marked non-basic so `Bind()` will copy the length mod.
    if (conv->length_mod == LengthMod::l && c == 'c') {
      conv->flags = conv->flags | Flags::kNonBasic;
    }
  }
#undef ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR

  assert(CheckFastPathSetting(*conv));
  (void)(&CheckFastPathSetting);

  conv->conv = tag.as_conv();
  if (!is_positional) conv->arg_position = ++*next_arg;
  return pos;
}